

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

int dictExpand(dict *ht,unsigned_long size)

{
  dictEntry *pdVar1;
  uint uVar2;
  bool bVar3;
  uint h;
  dictEntry *nextHe;
  dictEntry *he;
  unsigned_long i;
  unsigned_long realsize;
  dict n;
  unsigned_long size_local;
  dict *ht_local;
  
  n.privdata = (void *)size;
  n.type = (dictType *)_dictNextPower(size);
  if (n.privdata < (void *)ht->used) {
    ht_local._4_4_ = 1;
  }
  else {
    _dictInit((dict *)&realsize,ht->type,ht->privdata);
    n.size = (long)&n.type[-1].valDestructor + 7;
    realsize = (unsigned_long)calloc((size_t)n.type,8);
    n.sizemask = ht->used;
    he = (dictEntry *)0x0;
    while( true ) {
      bVar3 = false;
      if (he < (dictEntry *)ht->size) {
        bVar3 = ht->used != 0;
      }
      if (!bVar3) break;
      if (ht->table[(long)he] != (dictEntry *)0x0) {
        nextHe = ht->table[(long)he];
        while (nextHe != (dictEntry *)0x0) {
          pdVar1 = nextHe->next;
          uVar2 = (*ht->type->hashFunction)(nextHe->key);
          uVar2 = uVar2 & (uint)n.size;
          nextHe->next = *(dictEntry **)(realsize + (ulong)uVar2 * 8);
          *(dictEntry **)(realsize + (ulong)uVar2 * 8) = nextHe;
          ht->used = ht->used - 1;
          nextHe = pdVar1;
        }
      }
      he = (dictEntry *)((long)&he->key + 1);
    }
    if (ht->used != 0) {
      __assert_fail("ht->used == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/dict.c"
                    ,0x7e,"int dictExpand(dict *, unsigned long)");
    }
    free(ht->table);
    memcpy(ht,&realsize,0x30);
    ht_local._4_4_ = 0;
  }
  return ht_local._4_4_;
}

Assistant:

static int dictExpand(dict *ht, unsigned long size) {
    dict n; /* the new hashtable */
    unsigned long realsize = _dictNextPower(size), i;

    /* the size is invalid if it is smaller than the number of
     * elements already inside the hashtable */
    if (ht->used > size)
        return DICT_ERR;

    _dictInit(&n, ht->type, ht->privdata);
    n.size = realsize;
    n.sizemask = realsize-1;
    n.table = calloc(realsize,sizeof(dictEntry*));

    /* Copy all the elements from the old to the new table:
     * note that if the old hash table is empty ht->size is zero,
     * so dictExpand just creates an hash table. */
    n.used = ht->used;
    for (i = 0; i < ht->size && ht->used > 0; i++) {
        dictEntry *he, *nextHe;

        if (ht->table[i] == NULL) continue;

        /* For each hash entry on this slot... */
        he = ht->table[i];
        while(he) {
            unsigned int h;

            nextHe = he->next;
            /* Get the new element index */
            h = dictHashKey(ht, he->key) & n.sizemask;
            he->next = n.table[h];
            n.table[h] = he;
            ht->used--;
            /* Pass to the next element */
            he = nextHe;
        }
    }
    assert(ht->used == 0);
    free(ht->table);

    /* Remap the new hashtable in the old */
    *ht = n;
    return DICT_OK;
}